

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  SQNativeClosure *x;
  SQObjectPtr *obj;
  long lVar1;
  bool bVar2;
  SQObjectPtr local_30;
  
  x = SQNativeClosure::Create(v->_sharedstate,func,nfreevars);
  x->_nparamscheck = 0;
  lVar1 = 0;
  while (bVar2 = nfreevars != 0, nfreevars = nfreevars - 1, bVar2) {
    obj = SQVM::Top(v);
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(x->_outervalues->super_SQObject)._type + lVar1),obj);
    SQVM::Pop(v);
    lVar1 = lVar1 + 0x10;
  }
  SQObjectPtr::SQObjectPtr(&local_30,x);
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}